

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::RgbaInputFile::FromYca::rotateBuf1(FromYca *this,int d)

{
  long lVar1;
  uint uVar2;
  Rgba *tmp [29];
  undefined8 auStack_108 [30];
  
  if (d < 0) {
    uVar2 = -((0x1cU - d) / 0x1d);
  }
  else {
    uVar2 = (uint)d / 0x1d;
  }
  memcpy(auStack_108,this->_buf1,0xe8);
  lVar1 = 0;
  do {
    this->_buf1[lVar1] = (Rgba *)auStack_108[(int)(d + uVar2 * -0x1d + (int)lVar1) % 0x1d];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1d);
  return;
}

Assistant:

void
RgbaInputFile::FromYca::rotateBuf1 (int d)
{
    d = modp (d, N + 2);

    Rgba *tmp[N + 2];

    for (int i = 0; i < N + 2; ++i)
	tmp[i] = _buf1[i];

    for (int i = 0; i < N + 2; ++i)
	_buf1[i] = tmp[(i + d) % (N + 2)];
}